

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_end(nk_context *ctx)

{
  nk_property_state *__s;
  nk_edit_state *__s_00;
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  nk_panel_type nVar13;
  int iVar14;
  uint uVar15;
  nk_window *pnVar16;
  nk_panel *pnVar17;
  nk_panel *pnVar18;
  nk_window *pnVar19;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var20;
  undefined1 auVar21 [16];
  nk_vec2 nVar22;
  bool bVar23;
  nk_panel *pnVar24;
  nk_bool nVar25;
  uint uVar26;
  long lVar27;
  uint *puVar28;
  nk_panel *pnVar29;
  nk_page_element *pe;
  nk_window *pnVar30;
  nk_flags nVar31;
  nk_flags *pnVar32;
  nk_context *in;
  ulong uVar33;
  nk_command_buffer *b;
  bool bVar34;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect scroll;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect rect_03;
  nk_rect r_00;
  nk_flags state;
  nk_rect empty_east;
  nk_flags local_13c;
  nk_vec2 local_138;
  undefined8 uStack_130;
  nk_flags *local_120;
  undefined1 local_118 [24];
  nk_style *local_100;
  nk_rect local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  nk_rect local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    return;
  }
  pnVar16 = ctx->current;
  if (pnVar16 == (nk_window *)0x0) {
    return;
  }
  pnVar17 = pnVar16->layout;
  if (pnVar17 == (nk_panel *)0x0) goto LAB_0011ac9c;
  nVar13 = pnVar17->type;
  if (nVar13 == NK_PANEL_WINDOW) {
    if ((pnVar16->flags & 0x2000) != 0) goto LAB_0011ac9c;
    in = (nk_context *)0x0;
    if ((pnVar17->flags & 0x1400) == 0) {
      in = ctx;
    }
LAB_00119ea5:
    local_100 = &ctx->style;
    local_120 = &pnVar17->flags;
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(&pnVar16->buffer,r);
    nVar13 = pnVar17->type;
    nVar31 = pnVar17->flags;
  }
  else {
    local_100 = &ctx->style;
    local_120 = &pnVar17->flags;
    nVar31 = pnVar17->flags;
    in = (nk_context *)0x0;
    if ((nVar31 & 0x1400) == 0) {
      in = ctx;
    }
    if ((nVar13 & (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
                  NK_PANEL_GROUP)) == NK_PANEL_NONE) goto LAB_00119ea5;
  }
  b = &pnVar16->buffer;
  local_138 = (ctx->style).window.scrollbar_size;
  uStack_130 = 0;
  nVar22 = nk_panel_get_padding(local_100,nVar13);
  pnVar32 = local_120;
  fVar35 = (pnVar17->row).height + pnVar17->at_y;
  auVar21._8_4_ = extraout_XMM0_Dc;
  auVar21._0_4_ = nVar22.x;
  auVar21._4_4_ = nVar22.y;
  auVar21._12_4_ = extraout_XMM0_Dd;
  pnVar17->at_y = fVar35;
  local_118._0_16_ = auVar21;
  if ((nVar31 & 0x8800) == 0x800) {
    fVar36 = (pnVar17->bounds).y;
    if (fVar35 < (pnVar17->bounds).h + fVar36) {
      (pnVar17->bounds).h = fVar35 - fVar36;
    }
    local_118._4_4_ = nVar22.y;
    rect.y = fVar36;
    rect.x = (pnVar16->bounds).x;
    rect.h = (float)local_118._4_4_;
    rect.w = (pnVar16->bounds).w;
    nk_fill_rect(b,rect,0.0,(ctx->style).window.background);
    rect_00.w = pnVar17->border + (float)local_118._0_4_;
    rect_00.y = (pnVar17->bounds).y;
    rect_00.x = (pnVar16->bounds).x;
    rect_00.h = (pnVar17->bounds).h;
    nk_fill_rect(b,rect_00,0.0,(ctx->style).window.background);
    rect_01.x = (pnVar17->bounds).x + (pnVar17->bounds).w;
    fVar35 = pnVar17->border + (float)local_118._0_4_;
    if ((*pnVar17->offset_y == 0) && ((*pnVar32 & 0x20) == 0)) {
      fVar35 = fVar35 + local_138.x;
    }
    rect_01.y = (pnVar17->bounds).y;
    rect_01.h = (pnVar17->bounds).h;
    rect_01.w = fVar35;
    nk_fill_rect(b,rect_01,0.0,(ctx->style).window.background);
    if (0.0 < pnVar17->footer_height) {
      rect_02.y = (pnVar17->bounds).y + (pnVar17->bounds).h;
      rect_02.x = (pnVar16->bounds).x;
      rect_02.h = pnVar17->footer_height;
      rect_02.w = (pnVar16->bounds).w;
      nk_fill_rect(b,rect_02,0.0,(ctx->style).window.background);
    }
  }
  if (((*pnVar32 & 0x8020) == 0) &&
     (pnVar16->scrollbar_hiding_timer <= 4.0 && pnVar16->scrollbar_hiding_timer != 4.0)) {
    if ((pnVar17->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
        NK_PANEL_GROUP)) == NK_PANEL_NONE) {
      if (pnVar16 == ctx->active) {
        bVar34 = pnVar17->has_scrolling != 0;
      }
      else {
        bVar34 = false;
      }
      if (in != (nk_context *)0x0) {
        bVar23 = bVar34;
        if ((in->input).mouse.scroll_delta.y <= 0.0) {
          bVar23 = (bool)(0.0 < (in->input).mouse.scroll_delta.x & bVar34);
        }
        if (bVar23 != false) {
          pnVar16->scrolled = 1;
          goto LAB_0011a1cc;
        }
      }
      pnVar16->scrolled = 0;
    }
    else {
      pnVar18 = pnVar16->layout;
      pnVar24 = pnVar18;
      do {
        pnVar29 = pnVar24;
        pnVar24 = pnVar29->parent;
        pnVar19 = pnVar16;
      } while (pnVar29->parent != (nk_panel *)0x0);
      do {
        pnVar30 = pnVar19;
        pnVar19 = pnVar30->parent;
      } while (pnVar19 != (nk_window *)0x0);
      if (((pnVar30 == ctx->active) && (pnVar17->has_scrolling != 0)) && (in != (nk_context *)0x0))
      {
        uVar2 = (pnVar17->bounds).x;
        uVar8 = (pnVar17->bounds).y;
        fVar35 = (in->input).mouse.pos.x;
        bVar34 = false;
        if ((float)uVar2 <= fVar35) {
          uVar3 = (pnVar17->bounds).w;
          uVar9 = (pnVar17->bounds).h;
          if (fVar35 < (float)uVar2 + (float)uVar3) {
            fVar35 = (in->input).mouse.pos.y;
            bVar34 = false;
            if (((float)uVar8 <= fVar35) && (fVar35 < (float)uVar8 + (float)uVar9)) {
              fVar35 = (pnVar29->clip).x;
              if ((((float)uVar2 + (float)uVar3 <= fVar35) ||
                  ((fVar35 + (pnVar29->clip).w <= (float)uVar2 ||
                   (fVar35 = (pnVar29->clip).y, (float)uVar8 + (float)uVar9 <= fVar35)))) ||
                 (fVar35 + (pnVar29->clip).h <= (float)uVar8)) goto LAB_0011a08b;
              for (pnVar24 = pnVar18->parent; pnVar24 != (nk_panel *)0x0; pnVar24 = pnVar24->parent)
              {
                pnVar18->has_scrolling = 0;
                pnVar18 = pnVar24;
              }
              pnVar18->has_scrolling = 0;
              bVar34 = true;
            }
          }
        }
      }
      else {
LAB_0011a08b:
        bVar34 = false;
      }
    }
LAB_0011a1cc:
    local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
    fVar35 = (pnVar17->bounds).y;
    scroll.x = (pnVar17->bounds).x + (pnVar17->bounds).w + (float)local_118._0_4_;
    fVar36 = (pnVar17->bounds).h;
    scroll.y = fVar35;
    scroll.h = fVar36;
    scroll.w = local_138.x;
    fVar35 = nk_do_scrollbarv((nk_flags *)&local_f8,b,scroll,(uint)bVar34,(float)*pnVar17->offset_y,
                              (float)(int)(pnVar17->at_y - fVar35),fVar36 * 0.1,fVar36 * 0.01,
                              &(ctx->style).scrollv,&in->input,(ctx->style).font);
    *pnVar17->offset_y = (nk_uint)(long)fVar35;
    if ((in != (nk_context *)0x0) && (bVar34 != false)) {
      (in->input).mouse.scroll_delta.y = 0.0;
    }
    local_13c = 0;
    fVar35 = (pnVar17->bounds).x;
    fVar40 = (pnVar17->bounds).y + (pnVar17->bounds).h;
    fVar36 = pnVar17->max_x;
    fVar38 = (float)(int)(fVar36 - fVar35);
    font = (ctx->style).font;
    local_f8.h = 1.0;
    if (1.0 <= local_138.y) {
      local_f8.h = local_138.y;
    }
    fVar41 = local_f8.h + local_f8.h;
    fVar37 = (pnVar17->bounds).w;
    local_f8.w = fVar41;
    if (fVar41 <= fVar37) {
      local_f8.w = fVar37;
    }
    local_f8._0_8_ = CONCAT44(fVar40,fVar35);
    fVar37 = 0.0;
    if (local_f8.w < fVar38) {
      fVar39 = (float)*pnVar17->offset_x;
      fVar37 = fVar36 * 0.05;
      local_c8 = ZEXT416((uint)fVar38);
      local_e8._0_4_ = local_f8.w;
      local_e8._4_4_ = 0;
      local_e8._8_4_ = 0;
      local_e8._12_4_ = 0;
      local_d8._4_4_ = 0;
      local_d8._8_4_ = 0;
      local_d8._12_4_ = 0;
      local_50.y = fVar40;
      local_50.h = local_f8.h;
      if ((ctx->style).scrollh.show_buttons != 0) {
        local_78 = ZEXT416((uint)fVar41);
        local_a8 = ZEXT416((uint)fVar40);
        local_e8 = ZEXT416((uint)local_f8.w);
        local_d8 = ZEXT416((uint)fVar35);
        fVar38 = fVar37;
        if (fVar36 * 0.005 <= fVar37) {
          fVar38 = fVar36 * 0.005;
        }
        local_98 = ZEXT416((uint)local_f8.h);
        local_68 = CONCAT44(fVar40,fVar35);
        uStack_60 = 0;
        bounds.y = fVar40;
        bounds.x = fVar35;
        bounds.h = local_f8.h;
        bounds.w = local_f8.h;
        local_88 = local_f8.h;
        fStack_84 = local_f8.h;
        fStack_80 = local_f8.h;
        fStack_7c = local_f8.h;
        nVar25 = nk_do_button_symbol((nk_flags *)&local_b8,b,bounds,(ctx->style).scrollh.dec_symbol,
                                     NK_BUTTON_REPEATER,&(ctx->style).scrollh.dec_button,&in->input,
                                     font);
        fVar35 = 0.0;
        if (nVar25 != 0) {
          fVar35 = fVar38;
        }
        fVar39 = fVar39 - fVar35;
        fVar35 = (float)local_d8._0_4_ + (float)local_e8._0_4_;
        local_e8._0_4_ = (float)local_e8._0_4_ - (float)local_78._0_4_;
        bounds_00.h = fStack_84;
        bounds_00.w = local_88;
        bounds_00.y = (float)local_68._4_4_;
        bounds_00.x = fVar35 - (float)local_98._0_4_;
        nVar25 = nk_do_button_symbol((nk_flags *)&local_b8,b,bounds_00,
                                     (ctx->style).scrollh.inc_symbol,NK_BUTTON_REPEATER,
                                     &(ctx->style).scrollh.inc_button,&in->input,font);
        if (nVar25 != 0) {
          fVar39 = fVar39 + fVar38;
        }
        fVar35 = (float)local_d8._0_4_ + (float)local_98._0_4_;
        local_f8.x = fVar35;
        fVar38 = (float)local_c8._0_4_;
        local_50.y = (float)local_a8._0_4_;
        local_50.h = (float)local_98._0_4_;
      }
      if ((float)local_e8._0_4_ <= fVar37) {
        fVar37 = (float)local_e8._0_4_;
      }
      if (fVar38 - (float)local_e8._0_4_ <= fVar39) {
        fVar39 = fVar38 - (float)local_e8._0_4_;
      }
      fVar36 = 0.0;
      if (0.0 <= fVar39) {
        fVar36 = fVar39;
      }
      fVar40 = (ctx->style).scrollh.border;
      nVar22 = (ctx->style).scrollh.padding;
      fVar41 = nVar22.x;
      fVar39 = nVar22.y;
      local_b8.x = (fVar36 / fVar38) * (float)local_e8._0_4_ + fVar35 + fVar40 + fVar41;
      local_b8.y = local_50.y + fVar40 + fVar39;
      local_b8.w = ((float)local_e8._0_4_ / fVar38) * (float)local_e8._0_4_ -
                   (fVar41 + fVar41 + fVar40 + fVar40);
      local_b8.h = local_50.h - (fVar39 + fVar39 + fVar40 + fVar40);
      local_d8._0_4_ = fVar35;
      local_50.x = local_b8.w + local_b8.x;
      local_40.w = local_b8.x - fVar35;
      local_50.w = (fVar35 + (float)local_e8._0_4_) - local_50.x;
      local_f8.w = (float)local_e8._0_4_;
      local_40.x = fVar35;
      local_40.y = local_50.y;
      local_40.h = local_50.h;
      fVar37 = nk_scrollbar_behavior
                         (&local_13c,&in->input,(uint)bVar34,&local_f8,&local_b8,&local_40,&local_50
                          ,fVar36,fVar38,fVar37,NK_HORIZONTAL);
      local_b8.x = (fVar37 / (float)local_c8._0_4_) * (float)local_e8._0_4_ + (float)local_d8._0_4_;
      p_Var20 = (ctx->style).scrollh.draw_begin;
      if (p_Var20 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var20)(b,(ctx->style).scrollh.userdata);
      }
      nk_draw_scrollbar(b,local_13c,&(ctx->style).scrollh,&local_f8,&local_b8);
      p_Var20 = (ctx->style).scrollh.draw_end;
      if (p_Var20 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var20)(b,(ctx->style).scrollh.userdata);
      }
    }
    *pnVar17->offset_x = (nk_uint)(long)fVar37;
    pnVar32 = local_120;
  }
  if ((pnVar16->flags & 0x80) == 0) {
LAB_0011a68d:
    pnVar16->scrollbar_hiding_timer = 0.0;
  }
  else {
    fVar35 = (ctx->input).mouse.delta.x;
    if ((((fVar35 != 0.0) || (NAN(fVar35))) || (fVar35 = (ctx->input).mouse.delta.y, fVar35 != 0.0))
       || (NAN(fVar35))) {
      pnVar19 = ctx->current;
      if ((pnVar19 == (nk_window *)0x0) || ((pnVar19->flags & 0x2000) != 0)) {
LAB_0011a710:
        bVar34 = false;
      }
      else {
        uVar4 = (pnVar19->bounds).x;
        uVar10 = (pnVar19->bounds).y;
        fVar35 = (ctx->input).mouse.pos.x;
        bVar34 = false;
        if (((float)uVar4 <= fVar35) &&
           (uVar5 = (pnVar19->bounds).w, uVar11 = (pnVar19->bounds).h,
           fVar35 < (float)uVar4 + (float)uVar5)) {
          fVar35 = (ctx->input).mouse.pos.y;
          if (fVar35 < (float)uVar10) goto LAB_0011a710;
          bVar34 = fVar35 < (float)uVar10 + (float)uVar11;
        }
      }
LAB_0011a712:
      if ((bVar34) || ((ctx->last_widget_state & 2) != 0)) goto LAB_0011a68d;
    }
    else {
      fVar35 = (ctx->input).mouse.scroll_delta.y;
      nVar25 = nk_window_is_hovered(ctx);
      bVar34 = nVar25 != 0;
      pnVar32 = local_120;
      if (fVar35 != 0.0 || !bVar34) goto LAB_0011a712;
    }
    pnVar16->scrollbar_hiding_timer = ctx->delta_time_seconds + pnVar16->scrollbar_hiding_timer;
  }
  uVar26 = *pnVar32;
  if ((uVar26 & 1) != 0) {
    nVar13 = pnVar17->type;
    lVar27 = 0x1cc4;
    if ((int)nVar13 < 0x20) {
      if (nVar13 == NK_PANEL_GROUP) {
        lVar27 = 0x1cd8;
      }
      else if (nVar13 == NK_PANEL_POPUP) {
        lVar27 = 0x1cc8;
      }
      else if (nVar13 == NK_PANEL_CONTEXTUAL) {
        lVar27 = 0x1cd0;
      }
    }
    else if (nVar13 == NK_PANEL_COMBO) {
      lVar27 = 0x1ccc;
    }
    else if ((nVar13 == NK_PANEL_MENU) || (nVar13 == NK_PANEL_TOOLTIP)) {
      lVar27 = 0x1cd4;
    }
    if ((short)uVar26 < 0) {
      fVar35 = (ctx->style).window.border + (pnVar16->bounds).y + pnVar17->header_height;
    }
    else if ((uVar26 >> 0xb & 1) == 0) {
      fVar35 = (pnVar16->bounds).y + (pnVar16->bounds).h;
    }
    else {
      fVar35 = (pnVar17->bounds).y + (pnVar17->bounds).h + pnVar17->footer_height;
    }
    uVar6 = (pnVar16->bounds).x;
    uVar12 = (pnVar16->bounds).y;
    rect_03.y = (float)uVar12;
    rect_03.x = (float)uVar6;
    uVar7 = (pnVar16->bounds).w;
    rect_03.h = fVar35 - (float)uVar12;
    rect_03.w = (float)uVar7;
    nk_stroke_rect(b,rect_03,0.0,pnVar17->border,
                   *(nk_color *)((long)local_100->cursors + lVar27 + -8));
    uVar26 = pnVar17->flags;
  }
  if ((in != (nk_context *)0x0) && ((uVar26 & 0x8004) == 4)) {
    fVar35 = (pnVar17->bounds).x;
    fVar36 = (pnVar17->bounds).y + (pnVar17->bounds).h;
    if ((uVar26 >> 9 & 1) == 0) {
      local_118._0_4_ = fVar35 + (pnVar17->bounds).w + (float)local_118._0_4_;
    }
    else {
      local_118._0_4_ = fVar35 + (float)local_118._0_4_ * -0.5;
    }
    if ((uVar26 & 0x20) != 0) {
      local_118._0_4_ = (float)local_118._0_4_ - local_138.x;
    }
    local_118._4_4_ = fVar36;
    local_118._8_8_ = 0;
    if ((ctx->style).window.scaler.type == NK_STYLE_ITEM_IMAGE) {
      r_00.y = fVar36;
      r_00.x = (float)local_118._0_4_;
      r_00.w = local_138.x;
      r_00.h = local_138.y;
      nk_draw_image(b,r_00,&(ctx->style).window.scaler.data.image,(nk_color)0xffffffff);
    }
    else {
      fVar38 = local_138.x + (float)local_118._0_4_;
      fVar35 = (float)local_118._0_4_;
      if ((uVar26 >> 9 & 1) == 0) {
        fVar35 = fVar38;
        fVar38 = (float)local_118._0_4_;
      }
      nk_fill_triangle(b,fVar35,fVar36,fVar35,local_138.y + fVar36,fVar38,local_138.y + fVar36,
                       (ctx->style).window.scaler.data.color);
    }
    if (((((pnVar16->flags & 0x1000) == 0) &&
         (fVar35 = (in->input).mouse.buttons[0].clicked_pos.x, (float)local_118._0_4_ <= fVar35)) &&
        (fVar35 < local_138.x + (float)local_118._0_4_)) &&
       (((fVar35 = (in->input).mouse.buttons[0].clicked_pos.y, (float)local_118._4_4_ <= fVar35 &&
         (fVar35 < local_138.y + (float)local_118._4_4_)) &&
        ((in->input).mouse.buttons[0].down == 1)))) {
      fVar35 = (ctx->style).window.min_size.x;
      fVar36 = (ctx->style).window.min_size.y;
      fVar38 = (in->input).mouse.delta.x;
      uVar26 = *pnVar32;
      fVar40 = fVar38;
      if ((uVar26 >> 9 & 1) != 0) {
        fVar40 = -fVar38;
        (pnVar16->bounds).x = (pnVar16->bounds).x + fVar38;
      }
      fVar41 = (pnVar16->bounds).w + fVar40;
      fVar37 = (float)local_118._0_4_;
      if ((fVar35 <= fVar41) &&
         ((fVar40 < 0.0 || ((0.0 < fVar40 && ((float)local_118._0_4_ <= (in->input).mouse.pos.x)))))
         ) {
        (pnVar16->bounds).w = fVar41;
        fVar37 = fVar38 + (float)local_118._0_4_;
      }
      fVar35 = (float)local_118._4_4_;
      if ((uVar26 >> 0xb & 1) == 0) {
        fVar38 = (in->input).mouse.delta.y;
        fVar40 = (pnVar16->bounds).h + fVar38;
        if ((fVar36 < fVar40) &&
           ((fVar38 < 0.0 || ((0.0 < fVar38 && ((float)local_118._4_4_ <= (in->input).mouse.pos.y)))
            ))) {
          (pnVar16->bounds).h = fVar40;
          fVar35 = fVar38 + (float)local_118._4_4_;
        }
      }
      (ctx->style).cursor_active = (ctx->style).cursors[6];
      nVar22.y = local_138.y * 0.5 + fVar35;
      nVar22.x = local_138.x * 0.5 + fVar37;
      (in->input).mouse.buttons[0].clicked_pos = nVar22;
    }
  }
  uVar26 = pnVar17->flags;
  if ((pnVar17->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
      NK_PANEL_GROUP)) == NK_PANEL_NONE) {
    if ((uVar26 >> 0xd & 1) == 0) {
      (pnVar16->buffer).end = (ctx->memory).allocated;
      if ((pnVar16->popup).buf.active != 0) {
        *(nk_size *)((long)(ctx->memory).memory.ptr + (pnVar16->popup).buf.parent + 8) =
             (pnVar16->popup).buf.end;
      }
    }
    else {
      (pnVar16->buffer).begin = 0;
      (pnVar16->buffer).end = 0;
      (pnVar16->buffer).last = 0;
      (pnVar16->buffer).clip = nk_null_rect;
      uVar26 = *pnVar32;
    }
  }
  if ((uVar26 >> 0x10 & 1) != 0) {
    uVar26 = uVar26 & 0xfffeefff;
    *pnVar32 = uVar26;
  }
  pnVar16->flags = uVar26;
  iVar14 = (pnVar16->property).active;
  if (iVar14 == 0) {
    uVar26 = (pnVar16->property).seq;
LAB_0011ab97:
    (pnVar16->property).old = uVar26;
    (pnVar16->property).prev = iVar14;
    (pnVar16->property).seq = 0;
  }
  else {
    uVar15 = (pnVar16->property).seq;
    uVar26 = (pnVar16->property).old;
    if ((uVar26 == uVar15) || (uVar26 = uVar15, iVar14 != (pnVar16->property).prev))
    goto LAB_0011ab97;
    __s = &pnVar16->property;
    uVar33 = (ulong)__s & 3;
    if (uVar33 == 0) {
      (pnVar16->property).select_start = 0;
      (pnVar16->property).select_end = 0;
      (pnVar16->property).name = 0;
      (pnVar16->property).seq = 0;
      (pnVar16->property).buffer[0x38] = '\0';
      (pnVar16->property).buffer[0x39] = '\0';
      (pnVar16->property).buffer[0x3a] = '\0';
      (pnVar16->property).buffer[0x3b] = '\0';
      (pnVar16->property).buffer[0x3c] = '\0';
      (pnVar16->property).buffer[0x3d] = '\0';
      (pnVar16->property).buffer[0x3e] = '\0';
      (pnVar16->property).buffer[0x3f] = '\0';
      (pnVar16->property).length = 0;
      (pnVar16->property).cursor = 0;
      (pnVar16->property).buffer[0x28] = '\0';
      (pnVar16->property).buffer[0x29] = '\0';
      (pnVar16->property).buffer[0x2a] = '\0';
      (pnVar16->property).buffer[0x2b] = '\0';
      (pnVar16->property).buffer[0x2c] = '\0';
      (pnVar16->property).buffer[0x2d] = '\0';
      (pnVar16->property).buffer[0x2e] = '\0';
      (pnVar16->property).buffer[0x2f] = '\0';
      (pnVar16->property).buffer[0x30] = '\0';
      (pnVar16->property).buffer[0x31] = '\0';
      (pnVar16->property).buffer[0x32] = '\0';
      (pnVar16->property).buffer[0x33] = '\0';
      (pnVar16->property).buffer[0x34] = '\0';
      (pnVar16->property).buffer[0x35] = '\0';
      (pnVar16->property).buffer[0x36] = '\0';
      (pnVar16->property).buffer[0x37] = '\0';
      (pnVar16->property).buffer[0x18] = '\0';
      (pnVar16->property).buffer[0x19] = '\0';
      (pnVar16->property).buffer[0x1a] = '\0';
      (pnVar16->property).buffer[0x1b] = '\0';
      (pnVar16->property).buffer[0x1c] = '\0';
      (pnVar16->property).buffer[0x1d] = '\0';
      (pnVar16->property).buffer[0x1e] = '\0';
      (pnVar16->property).buffer[0x1f] = '\0';
      (pnVar16->property).buffer[0x20] = '\0';
      (pnVar16->property).buffer[0x21] = '\0';
      (pnVar16->property).buffer[0x22] = '\0';
      (pnVar16->property).buffer[0x23] = '\0';
      (pnVar16->property).buffer[0x24] = '\0';
      (pnVar16->property).buffer[0x25] = '\0';
      (pnVar16->property).buffer[0x26] = '\0';
      (pnVar16->property).buffer[0x27] = '\0';
      (pnVar16->property).buffer[8] = '\0';
      (pnVar16->property).buffer[9] = '\0';
      (pnVar16->property).buffer[10] = '\0';
      (pnVar16->property).buffer[0xb] = '\0';
      (pnVar16->property).buffer[0xc] = '\0';
      (pnVar16->property).buffer[0xd] = '\0';
      (pnVar16->property).buffer[0xe] = '\0';
      (pnVar16->property).buffer[0xf] = '\0';
      (pnVar16->property).buffer[0x10] = '\0';
      (pnVar16->property).buffer[0x11] = '\0';
      (pnVar16->property).buffer[0x12] = '\0';
      (pnVar16->property).buffer[0x13] = '\0';
      (pnVar16->property).buffer[0x14] = '\0';
      (pnVar16->property).buffer[0x15] = '\0';
      (pnVar16->property).buffer[0x16] = '\0';
      (pnVar16->property).buffer[0x17] = '\0';
      __s->active = 0;
      __s->prev = 0;
      (pnVar16->property).buffer[0] = '\0';
      (pnVar16->property).buffer[1] = '\0';
      (pnVar16->property).buffer[2] = '\0';
      (pnVar16->property).buffer[3] = '\0';
      (pnVar16->property).buffer[4] = '\0';
      (pnVar16->property).buffer[5] = '\0';
      (pnVar16->property).buffer[6] = '\0';
      (pnVar16->property).buffer[7] = '\0';
      (pnVar16->property).old = 0;
      (pnVar16->property).state = 0;
    }
    else {
      memset(__s,0,4 - uVar33);
      puVar1 = (undefined8 *)((long)__s + (4 - uVar33));
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1[4] = 0;
      puVar1[5] = 0;
      puVar1[6] = 0;
      puVar1[7] = 0;
      puVar1[8] = 0;
      puVar1[9] = 0;
      puVar1[10] = 0;
      puVar1[0xb] = 0;
      *(undefined4 *)(puVar1 + 0xc) = 0;
      memset((void *)((long)puVar1 + 100),0,uVar33);
    }
  }
  iVar14 = (pnVar16->edit).active;
  if (iVar14 == 0) {
    uVar26 = (pnVar16->edit).seq;
LAB_0011ac28:
    (pnVar16->edit).old = uVar26;
    (pnVar16->edit).prev = iVar14;
    (pnVar16->edit).seq = 0;
  }
  else {
    uVar15 = (pnVar16->edit).seq;
    uVar26 = (pnVar16->edit).old;
    if ((uVar26 == uVar15) || (uVar26 = uVar15, iVar14 != (pnVar16->edit).prev)) goto LAB_0011ac28;
    __s_00 = &pnVar16->edit;
    uVar33 = (ulong)__s_00 & 3;
    if (uVar33 == 0) {
      (pnVar16->edit).sel_end = 0;
      (pnVar16->edit).scrollbar.x = 0;
      *(undefined8 *)&(pnVar16->edit).scrollbar.y = 0;
      (pnVar16->edit).prev = 0;
      (pnVar16->edit).cursor = 0;
      (pnVar16->edit).sel_start = 0;
      (pnVar16->edit).sel_end = 0;
      __s_00->name = 0;
      __s_00->seq = 0;
      (pnVar16->edit).old = 0;
      (pnVar16->edit).active = 0;
    }
    else {
      memset(__s_00,0,4 - uVar33);
      puVar1 = (undefined8 *)((long)__s_00 + (4 - uVar33));
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1[4] = 0;
      memset(puVar1 + 5,0,uVar33);
    }
  }
  if ((pnVar16->popup).active_con == 0) {
    uVar26 = (pnVar16->popup).con_count;
LAB_0011ac6f:
    puVar28 = &(pnVar16->popup).con_count;
    (pnVar16->popup).con_old = uVar26;
  }
  else {
    uVar26 = (pnVar16->popup).con_old;
    if (uVar26 == (pnVar16->popup).con_count) goto LAB_0011ac6f;
    puVar28 = &(pnVar16->popup).active_con;
    (pnVar16->popup).con_count = 0;
    (pnVar16->popup).con_old = 0;
  }
  *puVar28 = 0;
  (pnVar16->popup).combo_count = 0;
  nk_free_page_element(ctx,(nk_page_element *)ctx->current->layout);
LAB_0011ac9c:
  ctx->current = (nk_window *)0x0;
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
struct nk_panel *layout;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
if (!ctx || !ctx->current)
return;

layout = ctx->current->layout;
if (!layout || (layout->type == NK_PANEL_WINDOW && (ctx->current->flags & NK_WINDOW_HIDDEN))) {
ctx->current = 0;
return;
}
nk_panel_end(ctx);
nk_free_panel(ctx, ctx->current->layout);
ctx->current = 0;
}